

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

uint32_t ra_portable_header_size(roaring_array_t *ra)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint8_t uVar6;
  bool bVar7;
  bool bVar8;
  
  iVar1 = ra->size;
  uVar2 = (ulong)iVar1;
  bVar7 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    bVar7 = true;
    uVar5 = 1;
    do {
      uVar6 = ra->typecodes[uVar5 - 1];
      if (uVar6 == '\x04') {
        uVar6 = *(uint8_t *)((long)ra->containers[uVar5 - 1] + 8);
      }
      if (uVar6 == '\x03') break;
      bVar7 = uVar5 < uVar2;
      bVar8 = uVar5 != uVar2;
      uVar5 = uVar5 + 1;
    } while (bVar8);
  }
  if (!bVar7) {
    return iVar1 * 8 + 8;
  }
  uVar3 = iVar1 + 7;
  if (iVar1 < 4) {
    uVar4 = iVar1 + 0xe;
    if (-1 < (int)uVar3) {
      uVar4 = uVar3;
    }
    return ((int)uVar4 >> 3) + iVar1 * 4 + 4;
  }
  return (uVar3 >> 3) + iVar1 * 8 + 4;
}

Assistant:

uint32_t ra_portable_header_size(const roaring_array_t *ra) {
    if (ra_has_run_container(ra)) {
        if (ra->size <
            NO_OFFSET_THRESHOLD) {  // for small bitmaps, we omit the offsets
            return 4 + (ra->size + 7) / 8 + 4 * ra->size;
        }
        return 4 + (ra->size + 7) / 8 +
               8 * ra->size;  // - 4 because we pack the size with the cookie
    } else {
        return 4 + 4 + 8 * ra->size;
    }
}